

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O0

bool __thiscall
IndexTree::_insert(IndexTree *this,int32_t *root,int32_t new_node,int *balance_change)

{
  bool bVar1;
  int iVar2;
  Node *__s1;
  int *in_RCX;
  int in_EDX;
  IndexTree *in_RSI;
  IndexTree *in_RDI;
  int32_t *sub_tree_id;
  int result;
  int height_increase;
  Node *_new;
  Node *_root;
  int result_1;
  int64_t fast_result;
  int64_t *fast_that;
  int64_t *fast_this;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  Node *balance_change_00;
  undefined4 in_stack_ffffffffffffffb0;
  bool local_35;
  uint local_4;
  
  if (in_RSI->index_file_fd == -1) {
    in_RSI->index_file_fd = in_EDX;
    *in_RCX = 1;
    local_35 = false;
  }
  else {
    balance_change_00 = in_RDI->nodes + in_RSI->index_file_fd;
    __s1 = in_RDI->nodes + in_EDX;
    *in_RCX = 0;
    if (*(long *)__s1->key == *(long *)balance_change_00->key) {
      iVar2 = strcmp(__s1->key,balance_change_00->key);
      if (iVar2 < 0) {
        in_stack_ffffffffffffff7c = 0xffffffff;
        local_4 = in_stack_ffffffffffffff7c;
      }
      else {
        in_stack_ffffffffffffff7c = (uint)(0 < iVar2);
        local_4 = in_stack_ffffffffffffff7c;
      }
    }
    else {
      local_4 = 1;
      if (*(long *)__s1->key - *(long *)balance_change_00->key < 0) {
        local_4 = 0xffffffff;
      }
    }
    if (local_4 == 0) {
      in_RSI->index_file_fd = in_EDX;
      __s1->left = balance_change_00->left;
      __s1->right = balance_change_00->right;
      __s1->balance_factor = balance_change_00->balance_factor;
      local_35 = true;
    }
    else {
      bVar1 = _insert(in_RSI,(int32_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0),
                      (int32_t)((ulong)in_RCX >> 0x20),(int *)balance_change_00);
      if (bVar1) {
        local_35 = true;
      }
      else {
        iVar2 = *in_RCX;
        balance_change_00->balance_factor =
             balance_change_00->balance_factor + (short)(local_4 * iVar2);
        if ((local_4 * iVar2 == 0) || (balance_change_00->balance_factor == 0)) {
          *in_RCX = 0;
        }
        else {
          iVar2 = balance(in_RDI,(int32_t *)
                                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          *in_RCX = 1 - iVar2;
        }
        local_35 = false;
      }
    }
  }
  return local_35;
}

Assistant:

bool IndexTree::_insert(int32_t &root, int32_t new_node, int &balance_change) {

    if (root == -1) {
        root = new_node;
        balance_change = 1;
        return false;
    }

    auto &_root = nodes[root];
    auto &_new = nodes[new_node];
    balance_change = 0;
    int height_increase = 0;

//    printf("Insert querying: %d left %d right %d key %s\n", root, _root.left, _root.right, _root.key);

    auto result = fast_string_cmp(_new.key, _root.key);

    if (__glibc_likely(result != 0)) {
        auto &sub_tree_id = result == -1 ? _root.left : _root.right;
        if (_insert(sub_tree_id, new_node, balance_change)) {
            return true;
        }
        height_increase = result * balance_change;
    } else {
        // found existing node, replace it
        root = new_node;
        _new.left = _root.left;
        _new.right = _root.right;
        _new.balance_factor = _root.balance_factor;
        return true;
    }

    _root.balance_factor += height_increase;

    if (height_increase != 0 && _root.balance_factor != 0) {
        balance_change = 1 - balance(root);
    } else {
        balance_change = 0;
    }

    return false;

}